

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word_split.cpp
# Opt level: O0

void __thiscall
WordSplitStringTest_random_long_trailing_delim_Test<char16_t>::TestBody
          (WordSplitStringTest_random_long_trailing_delim_Test<char16_t> *this)

{
  pointer *__return_storage_ptr__;
  bool bVar1;
  char *pcVar2;
  AssertHelper local_118 [8];
  Message local_110 [8];
  undefined1 local_108 [8];
  AssertionResult gtest_ar;
  vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
  split_result;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_d0;
  undefined1 local_b0 [8];
  RandomWordTestData<char16_t,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
  data;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> delim;
  WordSplitStringTest_random_long_trailing_delim_Test<char16_t> *this_local;
  
  __return_storage_ptr__ =
       &data.m_token_indexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage;
  make_delim_long<char16_t,std::__cxx11::u16string>
            ((basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
             __return_storage_ptr__,8,L'\0');
  std::__cxx11::u16string::u16string
            ((u16string *)&local_d0,
             (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
             __return_storage_ptr__);
  RandomWordTestData<char16_t,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
  ::RandomWordTestData
            ((RandomWordTestData<char16_t,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
              *)local_b0,&local_d0,0,0);
  std::__cxx11::u16string::~u16string((u16string *)&local_d0);
  std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::
  operator+=((basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
             &data.m_fixed_word_length,
             (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
             &data.m_token_indexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  jessilib::
  word_split<std::vector,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_nullptr>
            ((container_type *)&gtest_ar.message_,
             (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
             &data.m_fixed_word_length,
             (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
             &data.m_token_indexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  testing::internal::EqHelper::
  Compare<std::vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>,_std::vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>,_nullptr>
            ((EqHelper *)local_108,"split_result","data.m_tokens",
             (vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
              *)&gtest_ar.message_,
             (vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
              *)((long)&data.m_str.field_2 + 8));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
  if (!bVar1) {
    testing::Message::Message(local_110);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_108);
    testing::internal::AssertHelper::AssertHelper
              (local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/word_split.cpp"
               ,0xff,pcVar2);
    testing::internal::AssertHelper::operator=(local_118,local_110);
    testing::internal::AssertHelper::~AssertHelper(local_118);
    testing::Message::~Message(local_110);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
  std::
  vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
             *)&gtest_ar.message_);
  RandomWordTestData<char16_t,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
  ::~RandomWordTestData
            ((RandomWordTestData<char16_t,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
              *)local_b0);
  std::__cxx11::u16string::~u16string
            ((u16string *)
             &data.m_token_indexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

TYPED_TEST(WordSplitStringTest, random_long_trailing_delim) {
	auto delim = make_delim_long<TypeParam>(8);
	RandomWordTestData<TypeParam> data{ delim };
	data.m_str += delim;
	std::vector<std::basic_string<TypeParam>> split_result = word_split(data.m_str, delim);
	EXPECT_EQ(split_result, data.m_tokens);
}